

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QFileInfo>::emplace<QFileInfo_const&>
          (QMovableArrayOps<QFileInfo> *this,qsizetype i,QFileInfo *args)

{
  QFileInfo **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QFileInfo *pQVar4;
  QFileInfo *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QFileInfo tmp;
  Inserter local_60;
  QFileInfo local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0022c76e:
    local_38.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(&local_38,args);
    bVar6 = (this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.size != 0;
    QArrayDataPointer<QFileInfo>::detachAndGrow
              ((QArrayDataPointer<QFileInfo> *)this,(uint)(i == 0 && bVar6),1,(QFileInfo **)0x0,
               (QArrayDataPointer<QFileInfo> *)0x0);
    if (i == 0 && bVar6) {
      QFileInfo::QFileInfo
                ((this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.ptr +
                 -1,&local_38);
      ppQVar1 = &(this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pQVar5 = (this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.ptr;
      pQVar4 = pQVar5 + i;
      pQVar5 = pQVar5 + i + 1;
      local_60.nInserts = 1;
      local_60.bytes =
           ((this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.size - i) *
           8;
      local_60.data = (QArrayDataPointer<QFileInfo> *)this;
      local_60.displaceFrom = pQVar4;
      local_60.displaceTo = pQVar5;
      memmove(pQVar5,pQVar4,local_60.bytes);
      QFileInfo::QFileInfo(pQVar4,&local_38);
      local_60.displaceFrom = pQVar5;
      Inserter::~Inserter(&local_60);
    }
    QFileInfo::~QFileInfo(&local_38);
  }
  else {
    if (((this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.size == i) &&
       (pQVar4 = (this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
       i)) {
      QFileInfo::QFileInfo(pQVar4 + i,args);
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.ptr,
         (QFileInfo *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pQVar4)) goto LAB_0022c76e;
      QFileInfo::QFileInfo(pQVar4 + -1,args);
      ppQVar1 = &(this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QFileInfo>).super_QArrayDataPointer<QFileInfo>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }